

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall
tcu::Matrix<tcu::Interval,_4,_2>::Matrix
          (Matrix<tcu::Interval,_4,_2> *this,Matrix<tcu::Interval,_4,_2> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  Vector<tcu::Interval,_4> *pVVar6;
  undefined8 *puVar7;
  long lVar8;
  bool bVar9;
  undefined1 auStack_68 [8];
  undefined8 local_60 [12];
  
  lVar5 = 0;
  pVVar6 = (Vector<tcu::Interval,_4> *)this;
  do {
    lVar8 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar6->m_data)->m_data[0].m_data +
       lVar8 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar6->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar8;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x68);
    lVar8 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar6->m_data)->m_data[0].m_data +
       lVar8 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar6->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar8;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x68);
    lVar5 = lVar5 + 0x60;
    pVVar6 = pVVar6 + 1;
  } while (lVar5 != 0xc0);
  lVar5 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    lVar8 = 8;
    do {
      auStack_68[lVar8] = 0;
      *(undefined8 *)((long)local_60 + lVar8) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_60 + lVar8 + 8) = 0xfff0000000000000;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x68);
    lVar8 = 8;
    do {
      auStack_68[lVar8] = 0;
      *(undefined8 *)((long)local_60 + lVar8) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_60 + lVar8 + 8) = 0xfff0000000000000;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x68);
    puVar7 = local_60;
    pVVar6 = (this->m_data).m_data + lVar5;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)pVVar6->m_data = *puVar7;
      puVar7 = puVar7 + 1;
      pVVar6 = (Vector<tcu::Interval,_4> *)&pVVar6->m_data[0].m_lo;
    }
    lVar5 = 1;
    bVar4 = false;
  } while (bVar9);
  lVar5 = -0x60;
  do {
    *(undefined8 *)((long)&(this->m_data).m_data[1].m_data[0].m_hi + lVar5) =
         *(undefined8 *)((long)&(src->m_data).m_data[1].m_data[0].m_hi + lVar5);
    pbVar1 = &(src->m_data).m_data[1].m_data[0].m_hasNaN + lVar5;
    dVar3 = *(double *)(pbVar1 + 8);
    pbVar2 = &(this->m_data).m_data[1].m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
    *(double *)(pbVar2 + 8) = dVar3;
    pbVar1 = &src[1].m_data.m_data[0].m_data[0].m_hasNaN + lVar5;
    dVar3 = *(double *)(pbVar1 + 8);
    pbVar2 = &this[1].m_data.m_data[0].m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
    *(double *)(pbVar2 + 8) = dVar3;
    *(undefined8 *)((long)&this[1].m_data.m_data[0].m_data[0].m_hi + lVar5) =
         *(undefined8 *)((long)&src[1].m_data.m_data[0].m_data[0].m_hi + lVar5);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}